

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_vendor.cpp
# Opt level: O1

bool __thiscall SimpleVendor::ProcessUserInput(SimpleVendor *this)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  
  bVar4 = (**(code **)(*(long *)this->vio + 0x40))();
  if (bVar4 < 100) {
    if (bVar4 < 0x4e) {
      if (bVar4 == 0x44) {
LAB_001025dd:
        piVar1 = &(this->super_Vendor).balance_;
        *piVar1 = *piVar1 + 10;
        return true;
      }
      if (bVar4 == 0x45) {
LAB_0010259a:
        uVar2 = (this->super_Vendor).balance_;
        uVar3 = uVar2 - 5;
        if ((uVar2 & 1) == 0) {
          uVar3 = uVar2;
        }
        (**(code **)(*(long *)this->vio + 0x10))(this->vio,uVar2,(int)uVar3 / 10);
        (this->super_Vendor).balance_ = 0;
        (**(code **)(*(long *)this->vio + 0x38))();
        return false;
      }
    }
    else {
      if (bVar4 == 0x4e) {
LAB_00102566:
        piVar1 = &(this->super_Vendor).balance_;
        *piVar1 = *piVar1 + 5;
        return true;
      }
      if (bVar4 == 0x51) {
LAB_0010261a:
        piVar1 = &(this->super_Vendor).balance_;
        *piVar1 = *piVar1 + 0x19;
        return true;
      }
      if (bVar4 == 0x52) goto LAB_001025e3;
    }
  }
  else if (bVar4 < 0x6e) {
    if (bVar4 == 100) goto LAB_001025dd;
    if (bVar4 == 0x65) goto LAB_0010259a;
  }
  else {
    if (bVar4 == 0x72) {
LAB_001025e3:
      uVar2 = (this->super_Vendor).balance_;
      uVar3 = uVar2 - 5;
      if ((uVar2 & 1) == 0) {
        uVar3 = uVar2;
      }
      (**(code **)(*(long *)this->vio + 0x10))(this->vio,uVar2,(int)uVar3 / 10);
      (this->super_Vendor).balance_ = 0;
      return true;
    }
    if (bVar4 == 0x71) goto LAB_0010261a;
    if (bVar4 == 0x6e) goto LAB_00102566;
  }
  (*(code *)**(undefined8 **)this->vio)(this->vio,"Unknown coin - rejected");
  return true;
}

Assistant:

bool SimpleVendor::ProcessUserInput() {
    switch (vio->GetUserInput()) {
        case 'n':
        case 'N':
            SetBalance(GetBalance() + VALUE_NICKLE);
            break;
        case 'd':
        case 'D':
            SetBalance(GetBalance() + VALUE_DIME);
            break;
        case 'q':
        case 'Q':
            SetBalance(GetBalance() + VALUE_QUARTER);
            break;
        case 'e':
        case 'E':
            DispenseChange();
            vio->PrintExitMessage();
            return false;
        case 'r':
        case 'R':
            DispenseChange();
            break;
        default:
            vio->PrintErrorMessage("Unknown coin - rejected");
    }
    return true;
}